

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O1

void noise_get_heavy(_func_void_void_ptr_int *func)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  FILE *pFVar5;
  size_t sVar6;
  uint uVar7;
  FILE *pFVar8;
  char buf [512];
  undefined1 auStack_4d0 [520];
  rusage rStack_2c8;
  _func_void_void_ptr_int *p_Stack_238;
  FILE *pFStack_230;
  undefined1 local_228 [512];
  
  pFVar8 = (FILE *)0x0;
  pFStack_230 = (FILE *)0x10cd6d;
  iVar2 = open("/dev/urandom",0);
  bVar1 = false;
  if (-1 < iVar2) {
    do {
      pFStack_230 = (FILE *)0x10cd8f;
      sVar4 = read(iVar2,local_228 + (long)pFVar8,(ulong)(0x20 - (int)pFVar8));
      iVar3 = (int)sVar4;
      bVar1 = iVar3 >= 0;
      if (iVar3 < 0) break;
      uVar7 = (int)pFVar8 + iVar3;
      pFVar8 = (FILE *)(ulong)uVar7;
    } while ((int)uVar7 < 0x20);
    pFStack_230 = (FILE *)0x10cda7;
    close(iVar2);
  }
  if (bVar1) {
    pFStack_230 = (FILE *)0x10cdb6;
    (*func)(local_228,0x20);
  }
  pFStack_230 = (FILE *)0x10cdc9;
  pFVar5 = popen("ps -axu 2>/dev/null","r");
  if (pFVar5 == (FILE *)0x0) {
    if (!bVar1) {
      pFStack_230 = (FILE *)0x10ce9f;
      noise_get_heavy_cold_1();
      goto LAB_0010ce9f;
    }
  }
  else {
    pFStack_230 = (FILE *)0x10cde6;
    sVar6 = fread(local_228,1,0x200,pFVar5);
    iVar2 = (int)sVar6;
    while (0 < iVar2) {
      pFStack_230 = (FILE *)0x10cdf4;
      (*func)(local_228,(int)sVar6);
      pFStack_230 = (FILE *)0x10ce09;
      sVar6 = fread(local_228,1,0x200,pFVar5);
      iVar2 = (int)sVar6;
    }
    pFStack_230 = (FILE *)0x10ce15;
    pclose(pFVar5);
    pFVar8 = pFVar5;
  }
  pFStack_230 = (FILE *)0x10ce2f;
  pFVar5 = popen("ls -al /tmp 2>/dev/null","r");
  if (pFVar5 == (FILE *)0x0) {
    if (!bVar1) {
LAB_0010ce9f:
      pFStack_230 = (FILE *)noise_regular;
      noise_get_heavy_cold_2();
      p_Stack_238 = func;
      pFStack_230 = pFVar8;
      iVar2 = open("/proc/meminfo",0);
      if (-1 < iVar2) {
        sVar4 = read(iVar2,auStack_4d0,0x200);
        iVar3 = (int)sVar4;
        while (0 < iVar3) {
          random_add_noise(NOISE_SOURCE_MEMINFO,auStack_4d0,(int)sVar4);
          sVar4 = read(iVar2,auStack_4d0,0x200);
          iVar3 = (int)sVar4;
        }
        close(iVar2);
      }
      iVar2 = open("/proc/stat",0);
      if (-1 < iVar2) {
        sVar4 = read(iVar2,auStack_4d0,0x200);
        iVar3 = (int)sVar4;
        while (0 < iVar3) {
          random_add_noise(NOISE_SOURCE_STAT,auStack_4d0,(int)sVar4);
          sVar4 = read(iVar2,auStack_4d0,0x200);
          iVar3 = (int)sVar4;
        }
        close(iVar2);
      }
      getrusage(RUSAGE_SELF,&rStack_2c8);
      random_add_noise(NOISE_SOURCE_RUSAGE,&rStack_2c8,0x90);
      return;
    }
  }
  else {
    pFStack_230 = (FILE *)0x10ce4c;
    sVar6 = fread(local_228,1,0x200,pFVar5);
    iVar2 = (int)sVar6;
    while (0 < iVar2) {
      pFStack_230 = (FILE *)0x10ce5a;
      (*func)(local_228,(int)sVar6);
      pFStack_230 = (FILE *)0x10ce6f;
      sVar6 = fread(local_228,1,0x200,pFVar5);
      iVar2 = (int)sVar6;
    }
    pFStack_230 = (FILE *)0x10ce7b;
    pclose(pFVar5);
  }
  pFStack_230 = (FILE *)0x10ce8a;
  read_random_seed(func);
  return;
}

Assistant:

void noise_get_heavy(void (*func) (void *, int))
{
    char buf[512];
    FILE *fp;
    int ret;
    bool got_dev_urandom = false;

    if (read_dev_urandom(buf, 32)) {
        got_dev_urandom = true;
        func(buf, 32);
    }

    fp = popen("ps -axu 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    fp = popen("ls -al /tmp 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    read_random_seed(func);
}